

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O3

void OPL::DOSBox::DBOPL::InitTables(void)

{
  undefined2 uVar1;
  char cVar2;
  char cVar10;
  undefined2 uVar18;
  undefined1 *puVar19;
  int i_2;
  Bitu i_4;
  ulong uVar20;
  int iVar21;
  short sVar22;
  int i;
  long lVar23;
  short *psVar24;
  int i_1;
  uint uVar25;
  uint uVar26;
  double dVar27;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar35;
  uint uVar36;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint uVar46;
  uint uVar48;
  uint uVar49;
  undefined1 auVar47 [16];
  uint uVar50;
  short sVar51;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  short sVar60;
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  uint uVar75;
  uint uVar77;
  uint uVar78;
  undefined1 auVar76 [16];
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  uint uVar83;
  undefined1 auVar84 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  long lVar42;
  undefined4 uVar52;
  undefined6 uVar53;
  undefined8 uVar54;
  undefined1 auVar55 [12];
  undefined1 auVar56 [14];
  undefined4 uVar61;
  undefined6 uVar62;
  undefined8 uVar63;
  undefined1 auVar64 [12];
  undefined1 auVar65 [14];
  undefined1 auVar67 [16];
  
  if (doneTables == '\0') {
    doneTables = '\x01';
    iVar21 = 0xff;
    lVar23 = 0;
    do {
      dVar27 = exp2((double)iVar21 * 0.00390625 + -1.0);
      *(short *)((long)&MulTable + lVar23) = (short)(int)(dVar27 * 65536.0 + 0.5);
      iVar21 = iVar21 + -8;
      lVar23 = lVar23 + 2;
    } while (lVar23 != 0x300);
    lVar23 = 0;
    do {
      dVar27 = sin(((double)(int)lVar23 + 0.5) * 0.006135923151542565);
      sVar22 = (short)(int)(dVar27 * 4084.0);
      (&DAT_0010c5d0)[lVar23] = sVar22;
      (&WaveTable)[lVar23] = -sVar22;
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0x200);
    iVar21 = 0xff;
    psVar24 = &DAT_0010cfce;
    lVar23 = 0;
    do {
      dVar27 = exp2((double)iVar21 * 0.00390625 + -1.0);
      sVar22 = (short)(int)(dVar27 * 4085.0 + 0.5);
      (&DAT_0010cfd0)[lVar23] = sVar22;
      *psVar24 = -sVar22;
      uVar18 = WaveTable;
      lVar23 = lVar23 + 1;
      iVar21 = iVar21 + -8;
      psVar24 = psVar24 + -1;
    } while (lVar23 != 0x100);
    lVar23 = 0;
    do {
      (&DAT_0010c9d0)[lVar23] = uVar18;
      (&DAT_0010cbd0)[lVar23] = uVar18;
      (&DAT_0010d3d0)[lVar23] = uVar18;
      (&DAT_0010d9d0)[lVar23] = uVar18;
      (&DAT_0010dbd0)[lVar23] = uVar18;
      (&DAT_0010d1d0)[lVar23] = (&DAT_0010c5d0)[lVar23];
      (&DAT_0010d5d0)[lVar23] = (&DAT_0010c5d0)[lVar23 * 2];
      (&DAT_0010d7d0)[lVar23] = (&WaveTable)[lVar23 * 2];
      uVar1 = (&DAT_0010c5d0)[lVar23 * 2];
      (&DAT_0010ddd0)[lVar23] = uVar1;
      (&DAT_0010dfd0)[lVar23] = uVar1;
      auVar43 = _DAT_00109350;
      auVar41 = _DAT_00109340;
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0x100);
    puVar19 = KslTable;
    lVar23 = 0;
    do {
      iVar21 = (int)lVar23;
      auVar68._0_4_ = iVar21 + -3;
      auVar68._4_4_ = iVar21 + -2;
      auVar68._8_4_ = iVar21 + -1;
      auVar68._12_4_ = iVar21;
      auVar74._0_4_ = iVar21 + -8;
      auVar74._4_4_ = iVar21 + -6;
      auVar74._8_4_ = iVar21 + -5;
      auVar74._12_4_ = iVar21 + -4;
      auVar72._0_4_ = iVar21 + -0x10;
      auVar72._4_4_ = iVar21 + -0xc;
      auVar72._8_4_ = iVar21 + -0xb;
      auVar72._12_4_ = iVar21 + -10;
      auVar58._0_4_ = iVar21 + -0x40;
      auVar58._4_4_ = iVar21 + -0x20;
      auVar58._8_4_ = iVar21 + -0x18;
      auVar58._12_4_ = iVar21 + -0x13;
      auVar57._0_4_ = -(uint)(0 < auVar58._0_4_);
      auVar57._4_4_ = -(uint)(0 < auVar58._4_4_);
      auVar57._8_4_ = -(uint)(0 < auVar58._8_4_);
      auVar57._12_4_ = -(uint)(0 < auVar58._12_4_);
      auVar73._0_4_ = -(uint)(0 < auVar72._0_4_);
      auVar73._4_4_ = -(uint)(0 < auVar72._4_4_);
      auVar73._8_4_ = -(uint)(0 < auVar72._8_4_);
      auVar73._12_4_ = -(uint)(0 < auVar72._12_4_);
      auVar66._0_4_ = -(uint)(0 < auVar74._0_4_);
      auVar66._4_4_ = -(uint)(0 < auVar74._4_4_);
      auVar66._8_4_ = -(uint)(0 < auVar74._8_4_);
      auVar66._12_4_ = -(uint)(0 < auVar74._12_4_);
      auVar69._0_4_ = -(uint)(0 < auVar68._0_4_);
      auVar69._4_4_ = -(uint)(0 < auVar68._4_4_);
      auVar69._8_4_ = -(uint)(0 < auVar68._8_4_);
      auVar69._12_4_ = -(uint)(0 < iVar21);
      auVar69 = auVar68 & auVar41 & auVar69;
      auVar66 = auVar74 & auVar41 & auVar66;
      sVar22 = auVar66._0_2_;
      cVar2 = (0 < sVar22) * (sVar22 < 0x100) * auVar66[0] - (0xff < sVar22);
      sVar22 = auVar66._2_2_;
      sVar60 = CONCAT11((0 < sVar22) * (sVar22 < 0x100) * auVar66[2] - (0xff < sVar22),cVar2);
      sVar22 = auVar66._4_2_;
      cVar3 = (0 < sVar22) * (sVar22 < 0x100) * auVar66[4] - (0xff < sVar22);
      sVar22 = auVar66._6_2_;
      uVar61 = CONCAT13((0 < sVar22) * (sVar22 < 0x100) * auVar66[6] - (0xff < sVar22),
                        CONCAT12(cVar3,sVar60));
      sVar22 = auVar66._8_2_;
      cVar4 = (0 < sVar22) * (sVar22 < 0x100) * auVar66[8] - (0xff < sVar22);
      sVar22 = auVar66._10_2_;
      uVar62 = CONCAT15((0 < sVar22) * (sVar22 < 0x100) * auVar66[10] - (0xff < sVar22),
                        CONCAT14(cVar4,uVar61));
      sVar22 = auVar66._12_2_;
      cVar5 = (0 < sVar22) * (sVar22 < 0x100) * auVar66[0xc] - (0xff < sVar22);
      sVar22 = auVar66._14_2_;
      uVar63 = CONCAT17((0 < sVar22) * (sVar22 < 0x100) * auVar66[0xe] - (0xff < sVar22),
                        CONCAT16(cVar5,uVar62));
      sVar22 = auVar69._0_2_;
      cVar6 = (0 < sVar22) * (sVar22 < 0x100) * auVar69[0] - (0xff < sVar22);
      sVar22 = auVar69._2_2_;
      auVar64._0_10_ =
           CONCAT19((0 < sVar22) * (sVar22 < 0x100) * auVar69[2] - (0xff < sVar22),
                    CONCAT18(cVar6,uVar63));
      sVar22 = auVar69._4_2_;
      cVar7 = (0 < sVar22) * (sVar22 < 0x100) * auVar69[4] - (0xff < sVar22);
      auVar64[10] = cVar7;
      sVar22 = auVar69._6_2_;
      auVar64[0xb] = (0 < sVar22) * (sVar22 < 0x100) * auVar69[6] - (0xff < sVar22);
      sVar22 = auVar69._8_2_;
      cVar8 = (0 < sVar22) * (sVar22 < 0x100) * auVar69[8] - (0xff < sVar22);
      auVar65[0xc] = cVar8;
      auVar65._0_12_ = auVar64;
      sVar22 = auVar69._10_2_;
      auVar65[0xd] = (0 < sVar22) * (sVar22 < 0x100) * auVar69[10] - (0xff < sVar22);
      sVar22 = auVar69._12_2_;
      cVar9 = (0 < sVar22) * (sVar22 < 0x100) * auVar69[0xc] - (0xff < sVar22);
      auVar67[0xe] = cVar9;
      auVar67._0_14_ = auVar65;
      sVar22 = auVar69._14_2_;
      auVar67[0xf] = (0 < sVar22) * (sVar22 < 0x100) * auVar69[0xe] - (0xff < sVar22);
      auVar73 = auVar72 & auVar41 & auVar73;
      auVar57 = auVar58 & auVar41 & auVar57;
      sVar22 = auVar57._0_2_;
      cVar10 = (0 < sVar22) * (sVar22 < 0x100) * auVar57[0] - (0xff < sVar22);
      sVar22 = auVar57._2_2_;
      sVar51 = CONCAT11((0 < sVar22) * (sVar22 < 0x100) * auVar57[2] - (0xff < sVar22),cVar10);
      sVar22 = auVar57._4_2_;
      cVar11 = (0 < sVar22) * (sVar22 < 0x100) * auVar57[4] - (0xff < sVar22);
      sVar22 = auVar57._6_2_;
      uVar52 = CONCAT13((0 < sVar22) * (sVar22 < 0x100) * auVar57[6] - (0xff < sVar22),
                        CONCAT12(cVar11,sVar51));
      sVar22 = auVar57._8_2_;
      cVar12 = (0 < sVar22) * (sVar22 < 0x100) * auVar57[8] - (0xff < sVar22);
      sVar22 = auVar57._10_2_;
      uVar53 = CONCAT15((0 < sVar22) * (sVar22 < 0x100) * auVar57[10] - (0xff < sVar22),
                        CONCAT14(cVar12,uVar52));
      sVar22 = auVar57._12_2_;
      cVar13 = (0 < sVar22) * (sVar22 < 0x100) * auVar57[0xc] - (0xff < sVar22);
      sVar22 = auVar57._14_2_;
      uVar54 = CONCAT17((0 < sVar22) * (sVar22 < 0x100) * auVar57[0xe] - (0xff < sVar22),
                        CONCAT16(cVar13,uVar53));
      sVar22 = auVar73._0_2_;
      cVar14 = (0 < sVar22) * (sVar22 < 0x100) * auVar73[0] - (0xff < sVar22);
      sVar22 = auVar73._2_2_;
      auVar55._0_10_ =
           CONCAT19((0 < sVar22) * (sVar22 < 0x100) * auVar73[2] - (0xff < sVar22),
                    CONCAT18(cVar14,uVar54));
      sVar22 = auVar73._4_2_;
      cVar15 = (0 < sVar22) * (sVar22 < 0x100) * auVar73[4] - (0xff < sVar22);
      auVar55[10] = cVar15;
      sVar22 = auVar73._6_2_;
      auVar55[0xb] = (0 < sVar22) * (sVar22 < 0x100) * auVar73[6] - (0xff < sVar22);
      sVar22 = auVar73._8_2_;
      cVar16 = (0 < sVar22) * (sVar22 < 0x100) * auVar73[8] - (0xff < sVar22);
      auVar56[0xc] = cVar16;
      auVar56._0_12_ = auVar55;
      sVar22 = auVar73._10_2_;
      auVar56[0xd] = (0 < sVar22) * (sVar22 < 0x100) * auVar73[10] - (0xff < sVar22);
      sVar22 = auVar73._12_2_;
      cVar17 = (0 < sVar22) * (sVar22 < 0x100) * auVar73[0xc] - (0xff < sVar22);
      auVar70[0xe] = cVar17;
      auVar70._0_14_ = auVar56;
      sVar22 = auVar73._14_2_;
      auVar70[0xf] = (0 < sVar22) * (sVar22 < 0x100) * auVar73[0xe] - (0xff < sVar22);
      sVar22 = (short)((uint)uVar52 >> 0x10);
      auVar71[1] = (0 < sVar22) * (sVar22 < 0x100) * cVar11 - (0xff < sVar22);
      auVar71[0] = (0 < sVar51) * (sVar51 < 0x100) * cVar10 - (0xff < sVar51);
      sVar22 = (short)((uint6)uVar53 >> 0x20);
      auVar71[2] = (0 < sVar22) * (sVar22 < 0x100) * cVar12 - (0xff < sVar22);
      sVar22 = (short)((ulong)uVar54 >> 0x30);
      auVar71[3] = (0 < sVar22) * (sVar22 < 0x100) * cVar13 - (0xff < sVar22);
      sVar22 = (short)((unkuint10)auVar55._0_10_ >> 0x40);
      auVar71[4] = (0 < sVar22) * (sVar22 < 0x100) * cVar14 - (0xff < sVar22);
      sVar22 = auVar55._10_2_;
      auVar71[5] = (0 < sVar22) * (sVar22 < 0x100) * cVar15 - (0xff < sVar22);
      sVar22 = auVar56._12_2_;
      auVar71[6] = (0 < sVar22) * (sVar22 < 0x100) * cVar16 - (0xff < sVar22);
      sVar22 = auVar70._14_2_;
      auVar71[7] = (0 < sVar22) * (sVar22 < 0x100) * cVar17 - (0xff < sVar22);
      auVar71[8] = (0 < sVar60) * (sVar60 < 0x100) * cVar2 - (0xff < sVar60);
      sVar22 = (short)((uint)uVar61 >> 0x10);
      auVar71[9] = (0 < sVar22) * (sVar22 < 0x100) * cVar3 - (0xff < sVar22);
      sVar22 = (short)((uint6)uVar62 >> 0x20);
      auVar71[10] = (0 < sVar22) * (sVar22 < 0x100) * cVar4 - (0xff < sVar22);
      sVar22 = (short)((ulong)uVar63 >> 0x30);
      auVar71[0xb] = (0 < sVar22) * (sVar22 < 0x100) * cVar5 - (0xff < sVar22);
      sVar22 = (short)((unkuint10)auVar64._0_10_ >> 0x40);
      auVar71[0xc] = (0 < sVar22) * (sVar22 < 0x100) * cVar6 - (0xff < sVar22);
      sVar22 = auVar64._10_2_;
      auVar71[0xd] = (0 < sVar22) * (sVar22 < 0x100) * cVar7 - (0xff < sVar22);
      sVar22 = auVar65._12_2_;
      auVar71[0xe] = (0 < sVar22) * (sVar22 < 0x100) * cVar8 - (0xff < sVar22);
      sVar22 = auVar67._14_2_;
      auVar71[0xf] = (0 < sVar22) * (sVar22 < 0x100) * cVar9 - (0xff < sVar22);
      auVar58 = psllw(auVar71,2);
      *(undefined1 (*) [16])puVar19 = auVar58 & auVar43;
      lVar23 = lVar23 + 8;
      puVar19 = (undefined1 *)((long)puVar19 + 0x10);
    } while (lVar23 != 0x40);
    puVar19 = &DAT_0010e653;
    lVar23 = 0;
    do {
      (&TremoloTable)[lVar23] = (char)lVar23;
      *puVar19 = (char)lVar23;
      lVar23 = lVar23 + 1;
      puVar19 = puVar19 + -1;
    } while (lVar23 != 0x1a);
    uVar26 = 4;
    uVar31 = 5;
    uVar33 = 6;
    uVar35 = 7;
    uVar80 = 0;
    uVar81 = 1;
    uVar82 = 2;
    uVar83 = 3;
    lVar23 = 0;
    auVar41 = _DAT_00109380;
    auVar43 = _DAT_00109390;
    auVar44 = _DAT_001092c0;
    auVar45 = _DAT_001092d0;
    do {
      uVar25 = uVar26 & 0xf;
      uVar30 = uVar31 & 0xf;
      uVar32 = uVar33 & 0xf;
      uVar34 = uVar35 & 0xf;
      uVar36 = uVar80 & 0xf;
      uVar38 = uVar81 & 0xf;
      uVar39 = uVar82 & 0xf;
      uVar40 = uVar83 & 0xf;
      auVar59._0_4_ = -(uint)(uVar36 < 9);
      auVar59._4_4_ = -(uint)(uVar38 < 9);
      auVar59._8_4_ = -(uint)(uVar39 < 9);
      auVar59._12_4_ = -(uint)(uVar40 < 9);
      auVar47._0_4_ = -(uint)(uVar25 < 9);
      auVar47._4_4_ = -(uint)(uVar30 < 9);
      auVar47._8_4_ = -(uint)(uVar32 < 9);
      auVar47._12_4_ = -(uint)(uVar34 < 9);
      auVar57 = packssdw(auVar59,auVar47);
      auVar84._0_4_ = uVar36 - 6;
      auVar84._4_4_ = uVar38 - 6;
      auVar84._8_4_ = uVar39 - 6;
      auVar84._12_4_ = uVar40 - 6;
      auVar76._0_4_ = uVar25 - 6;
      auVar76._4_4_ = uVar30 - 6;
      auVar76._8_4_ = uVar32 - 6;
      auVar76._12_4_ = uVar34 - 6;
      auVar76 = auVar76 ^ _DAT_001092e0;
      uVar46 = -(uint)(auVar76._0_4_ < -0x7ffffffd);
      uVar48 = -(uint)(auVar76._4_4_ < -0x7ffffffd);
      uVar49 = -(uint)(auVar76._8_4_ < -0x7ffffffd);
      uVar50 = -(uint)(auVar76._12_4_ < -0x7ffffffd);
      auVar84 = auVar84 ^ _DAT_001092e0;
      uVar75 = -(uint)(auVar84._0_4_ < -0x7ffffffd);
      uVar77 = -(uint)(auVar84._4_4_ < -0x7ffffffd);
      uVar78 = -(uint)(auVar84._8_4_ < -0x7ffffffd);
      uVar79 = -(uint)(auVar84._12_4_ < -0x7ffffffd);
      auVar58 = auVar45 ^ _DAT_001092e0;
      auVar70 = auVar44 ^ _DAT_001092e0;
      auVar71 = auVar43 ^ _DAT_001092e0;
      auVar74 = auVar41 ^ _DAT_001092e0;
      auVar28._0_4_ =
           (int)(((-(uint)(-0x80000000 < auVar58._4_4_ ||
                          auVar58._4_4_ == -0x80000000 && -0x7ffffff1 < auVar58._0_4_) & 9) +
                 (~uVar75 & (~-(uint)(uVar36 < 3) & uVar36 * 2 - 6 |
                            uVar36 * 2 & -(uint)(uVar36 < 3)) + (uint)(2 < uVar36) | uVar36 & uVar75
                 )) * 0x10000) >> 0x10;
      auVar28._4_4_ =
           (int)(((-(uint)(-0x80000000 < auVar58._12_4_ ||
                          auVar58._12_4_ == -0x80000000 && -0x7ffffff1 < auVar58._8_4_) & 9) +
                 (~uVar77 & (~-(uint)(uVar38 < 3) & uVar38 * 2 - 6 |
                            uVar38 * 2 & -(uint)(uVar38 < 3)) + (uint)(2 < uVar38) | uVar38 & uVar77
                 )) * 0x10000) >> 0x10;
      auVar28._8_4_ =
           (int)(((-(uint)(-0x80000000 < auVar70._4_4_ ||
                          auVar70._4_4_ == -0x80000000 && -0x7ffffff1 < auVar70._0_4_) & 9) +
                 (~uVar78 & (~-(uint)(uVar39 < 3) & uVar39 * 2 - 6 |
                            uVar39 * 2 & -(uint)(uVar39 < 3)) + (uint)(2 < uVar39) | uVar39 & uVar78
                 )) * 0x10000) >> 0x10;
      auVar28._12_4_ =
           (int)(((-(uint)(-0x80000000 < auVar70._12_4_ ||
                          auVar70._12_4_ == -0x80000000 && -0x7ffffff1 < auVar70._8_4_) & 9) +
                 (~uVar79 & (~-(uint)(uVar40 < 3) & uVar40 * 2 - 6 |
                            uVar40 * 2 & -(uint)(uVar40 < 3)) + (uint)(2 < uVar40) | uVar40 & uVar79
                 )) * 0x10000) >> 0x10;
      auVar37._0_4_ =
           (int)(((-(uint)(auVar71._4_4_ == -0x80000000 && -0x7ffffff1 < auVar71._0_4_ ||
                          -0x80000000 < auVar71._4_4_) & 9) +
                 (~uVar46 & (~-(uint)(uVar25 < 3) & uVar25 * 2 - 6 |
                            uVar25 * 2 & -(uint)(uVar25 < 3)) + (uint)(2 < uVar25) | uVar25 & uVar46
                 )) * 0x10000) >> 0x10;
      auVar37._4_4_ =
           (int)(((-(uint)(auVar71._12_4_ == -0x80000000 && -0x7ffffff1 < auVar71._8_4_ ||
                          -0x80000000 < auVar71._12_4_) & 9) +
                 (~uVar48 & (~-(uint)(uVar30 < 3) & uVar30 * 2 - 6 |
                            uVar30 * 2 & -(uint)(uVar30 < 3)) + (uint)(2 < uVar30) | uVar30 & uVar48
                 )) * 0x10000) >> 0x10;
      auVar37._8_4_ =
           (int)(((-(uint)(auVar74._4_4_ == -0x80000000 && -0x7ffffff1 < auVar74._0_4_ ||
                          -0x80000000 < auVar74._4_4_) & 9) +
                 (~uVar49 & (~-(uint)(uVar32 < 3) & uVar32 * 2 - 6 |
                            uVar32 * 2 & -(uint)(uVar32 < 3)) + (uint)(2 < uVar32) | uVar32 & uVar49
                 )) * 0x10000) >> 0x10;
      auVar37._12_4_ =
           (int)(((-(uint)(auVar74._12_4_ == -0x80000000 && -0x7ffffff1 < auVar74._8_4_ ||
                          -0x80000000 < auVar74._12_4_) & 9) +
                 (~uVar50 & (~-(uint)(uVar34 < 3) & uVar34 * 2 - 6 |
                            uVar34 * 2 & -(uint)(uVar34 < 3)) + (uint)(2 < uVar34) | uVar34 & uVar50
                 )) * 0x10000) >> 0x10;
      auVar58 = packssdw(auVar28,auVar37);
      auVar29._0_2_ = auVar58._0_2_ * 0xf8 + 0x2b8;
      auVar29._2_2_ = auVar58._2_2_ * 0xf8 + 0x2b8;
      auVar29._4_2_ = auVar58._4_2_ * 0xf8 + 0x2b8;
      auVar29._6_2_ = auVar58._6_2_ * 0xf8 + 0x2b8;
      auVar29._8_2_ = auVar58._8_2_ * 0xf8 + 0x2b8;
      auVar29._10_2_ = auVar58._10_2_ * 0xf8 + 0x2b8;
      auVar29._12_2_ = auVar58._12_2_ * 0xf8 + 0x2b8;
      auVar29._14_2_ = auVar58._14_2_ * 0xf8 + 0x2b8;
      *(undefined1 (*) [16])(ChanOffsetTable + lVar23) = auVar29 & auVar57;
      lVar42 = auVar45._8_8_;
      auVar45._0_8_ = auVar45._0_8_ + 8;
      auVar45._8_8_ = lVar42 + 8;
      lVar42 = auVar44._8_8_;
      auVar44._0_8_ = auVar44._0_8_ + 8;
      auVar44._8_8_ = lVar42 + 8;
      lVar42 = auVar43._8_8_;
      auVar43._0_8_ = auVar43._0_8_ + 8;
      auVar43._8_8_ = lVar42 + 8;
      lVar42 = auVar41._8_8_;
      auVar41._0_8_ = auVar41._0_8_ + 8;
      auVar41._8_8_ = lVar42 + 8;
      uVar80 = uVar80 + 8;
      uVar81 = uVar81 + 8;
      uVar82 = uVar82 + 8;
      uVar83 = uVar83 + 8;
      uVar26 = uVar26 + 8;
      uVar31 = uVar31 + 8;
      uVar33 = uVar33 + 8;
      uVar35 = uVar35 + 8;
      lVar23 = lVar23 + 0x10;
    } while (lVar23 != 0x40);
    psVar24 = &OpOffsetTable;
    uVar20 = 0;
    do {
      uVar26 = (uint)uVar20 & 7;
      if ((~(uint)uVar20 & 0x18) == 0 || 5 < uVar26) {
        sVar22 = 0;
      }
      else {
        uVar31 = uVar26 - 3;
        if (uVar26 < 3) {
          uVar31 = uVar26;
        }
        sVar22 = 0;
        if (uVar26 >= 3) {
          sVar22 = 0x68;
        }
        iVar21 = ((uint)(uVar20 >> 3) & 0x1fffffff) * 3;
        uVar33 = uVar31 + iVar21;
        uVar26 = uVar31 + 4 + iVar21;
        if (uVar33 < 0xc) {
          uVar26 = uVar33;
        }
        sVar22 = sVar22 + *(short *)(ChanOffsetTable + (ulong)uVar26 * 2);
      }
      *psVar24 = sVar22;
      uVar20 = uVar20 + 1;
      psVar24 = psVar24 + 1;
    } while (uVar20 != 0x40);
  }
  return;
}

Assistant:

void InitTables( void ) {
	if ( doneTables )
		return;
	doneTables = true;
#if ( DBOPL_WAVE == WAVE_HANDLER ) || ( DBOPL_WAVE == WAVE_TABLELOG )
	//Exponential volume table, same as the real adlib
	for ( int i = 0; i < 256; i++ ) {
		//Save them in reverse
		ExpTable[i] = (int)( 0.5 + ( pow(2.0, ( 255 - i) * ( 1.0 /256 ) )-1) * 1024 );
		ExpTable[i] += 1024; //or remove the -1 oh well :)
		//Preshift to the left once so the final volume can shift to the right
		ExpTable[i] *= 2;
	}
#endif
#if ( DBOPL_WAVE == WAVE_HANDLER )
	//Add 0.5 for the trunc rounding of the integer cast
	//Do a PI sinetable instead of the original 0.5 PI
	for ( int i = 0; i < 512; i++ ) {
		SinTable[i] = (Bit16s)( 0.5 - log10( sin( (i + 0.5) * (M_PI / 512.0) ) ) / log10(2.0)*256 );
	}
#endif
#if ( DBOPL_WAVE == WAVE_TABLEMUL )
	//Multiplication based tables
	for ( int i = 0; i < 384; i++ ) {
		int s = i * 8;
		//TODO maybe keep some of the precision errors of the original table?
		double val = ( 0.5 + ( pow(2.0, -1.0 + ( 255 - s) * ( 1.0 /256 ) )) * ( 1 << MUL_SH ));
		MulTable[i] = (Bit16u)(val);
	}

	//Sine Wave Base
	for ( int i = 0; i < 512; i++ ) {
		WaveTable[ 0x0200 + i ] = (Bit16s)(sin( (i + 0.5) * (M_PI / 512.0) ) * 4084);
		WaveTable[ 0x0000 + i ] = -WaveTable[ 0x200 + i ];
	}
	//Exponential wave
	for ( int i = 0; i < 256; i++ ) {
		WaveTable[ 0x700 + i ] = (Bit16s)( 0.5 + ( pow(2.0, -1.0 + ( 255 - i * 8) * ( 1.0 /256 ) ) ) * 4085 );
		WaveTable[ 0x6ff - i ] = -WaveTable[ 0x700 + i ];
	}
#endif
#if ( DBOPL_WAVE == WAVE_TABLELOG )
	//Sine Wave Base
	for ( int i = 0; i < 512; i++ ) {
		WaveTable[ 0x0200 + i ] = (Bit16s)( 0.5 - log10( sin( (i + 0.5) * (M_PI / 512.0) ) ) / log10(2.0)*256 );
		WaveTable[ 0x0000 + i ] = ((Bit16s)0x8000) | WaveTable[ 0x200 + i];
	}
	//Exponential wave
	for ( int i = 0; i < 256; i++ ) {
		WaveTable[ 0x700 + i ] = i * 8;
		WaveTable[ 0x6ff - i ] = ((Bit16s)0x8000) | i * 8;
	}
#endif

	//	|    |//\\|____|WAV7|//__|/\  |____|/\/\|
	//	|\\//|    |    |WAV7|    |  \/|    |    |
	//	|06  |0126|27  |7   |3   |4   |4 5 |5   |

#if (( DBOPL_WAVE == WAVE_TABLELOG ) || ( DBOPL_WAVE == WAVE_TABLEMUL ))
	for ( int i = 0; i < 256; i++ ) {
		//Fill silence gaps
		WaveTable[ 0x400 + i ] = WaveTable[0];
		WaveTable[ 0x500 + i ] = WaveTable[0];
		WaveTable[ 0x900 + i ] = WaveTable[0];
		WaveTable[ 0xc00 + i ] = WaveTable[0];
		WaveTable[ 0xd00 + i ] = WaveTable[0];
		//Replicate sines in other pieces
		WaveTable[ 0x800 + i ] = WaveTable[ 0x200 + i ];
		//double speed sines
		WaveTable[ 0xa00 + i ] = WaveTable[ 0x200 + i * 2 ];
		WaveTable[ 0xb00 + i ] = WaveTable[ 0x000 + i * 2 ];
		WaveTable[ 0xe00 + i ] = WaveTable[ 0x200 + i * 2 ];
		WaveTable[ 0xf00 + i ] = WaveTable[ 0x200 + i * 2 ];
	}
#endif

	//Create the ksl table
	for ( int oct = 0; oct < 8; oct++ ) {
		int base = oct * 8;
		for ( int i = 0; i < 16; i++ ) {
			int val = base - KslCreateTable[i];
			if ( val < 0 )
				val = 0;
			//*4 for the final range to match attenuation range
			KslTable[ oct * 16 + i ] = val * 4;
		}
	}
	//Create the Tremolo table, just increase and decrease a triangle wave
	for ( Bit8u i = 0; i < TREMOLO_TABLE / 2; i++ ) {
		Bit8u val = i << ENV_EXTRA;
		TremoloTable[i] = val;
		TremoloTable[TREMOLO_TABLE - 1 - i] = val;
	}
	//Create a table with offsets of the channels from the start of the chip
	DBOPL::Chip* chip = 0;
	for ( Bitu i = 0; i < 32; i++ ) {
		Bitu index = i & 0xf;
		if ( index >= 9 ) {
			ChanOffsetTable[i] = 0;
			continue;
		}
		//Make sure the four op channels follow eachother
		if ( index < 6 ) {
			index = (index % 3) * 2 + ( index / 3 );
		}
		//Add back the bits for highest ones
		if ( i >= 16 )
			index += 9;
		Bitu blah = reinterpret_cast<size_t>( &(chip->chan[ index ]) );
		ChanOffsetTable[i] = blah;
	}
	//Same for operators
	for ( Bitu i = 0; i < 64; i++ ) {
		if ( i % 8 >= 6 || ( (i / 8) % 4 == 3 ) ) {
			OpOffsetTable[i] = 0;
			continue;
		}
		Bitu chNum = (i / 8) * 3 + (i % 8) % 3;
		//Make sure we use 16 and up for the 2nd range to match the chanoffset gap
		if ( chNum >= 12 )
			chNum += 16 - 12;
		Bitu opNum = ( i % 8 ) / 3;
		DBOPL::Channel* chan = 0;
		Bitu blah = reinterpret_cast<size_t>( &(chan->op[opNum]) );
		OpOffsetTable[i] = ChanOffsetTable[ chNum ] + blah;
	}
#if 0
	//Stupid checks if table's are correct
	for ( Bitu i = 0; i < 18; i++ ) {
		Bit32u find = (Bit16u)( &(chip->chan[ i ]) );
		for ( Bitu c = 0; c < 32; c++ ) {
			if ( ChanOffsetTable[c] == find ) {
				find = 0;
				break;
			}
		}
		if ( find ) {
			find = find;
		}
	}
	for ( Bitu i = 0; i < 36; i++ ) {
		Bit32u find = (Bit16u)( &(chip->chan[ i / 2 ].op[i % 2]) );
		for ( Bitu c = 0; c < 64; c++ ) {
			if ( OpOffsetTable[c] == find ) {
				find = 0;
				break;
			}
		}
		if ( find ) {
			find = find;
		}
	}
#endif
}